

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O0

void af_glyph_hints_save(AF_GlyphHints hints,FT_Outline *outline)

{
  AF_Point_conflict pAVar1;
  char *local_38;
  char *tag;
  FT_Vector *vec;
  AF_Point_conflict limit;
  AF_Point_conflict point;
  FT_Outline *outline_local;
  AF_GlyphHints hints_local;
  
  limit = hints->points;
  pAVar1 = limit + hints->num_points;
  tag = (char *)outline->points;
  local_38 = outline->tags;
  for (; limit < pAVar1; limit = limit + 1) {
    *(FT_Pos *)tag = limit->x;
    *(FT_Pos *)(tag + 8) = limit->y;
    if ((limit->flags & 1) == 0) {
      if ((limit->flags & 2) == 0) {
        *local_38 = '\x01';
      }
      else {
        *local_38 = '\x02';
      }
    }
    else {
      *local_38 = '\0';
    }
    tag = tag + 0x10;
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_glyph_hints_save( AF_GlyphHints  hints,
                       FT_Outline*    outline )
  {
    AF_Point    point = hints->points;
    AF_Point    limit = point + hints->num_points;
    FT_Vector*  vec   = outline->points;
    char*       tag   = outline->tags;


    for ( ; point < limit; point++, vec++, tag++ )
    {
      vec->x = point->x;
      vec->y = point->y;

      if ( point->flags & AF_FLAG_CONIC )
        tag[0] = FT_CURVE_TAG_CONIC;
      else if ( point->flags & AF_FLAG_CUBIC )
        tag[0] = FT_CURVE_TAG_CUBIC;
      else
        tag[0] = FT_CURVE_TAG_ON;
    }
  }